

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O0

void mathCore::universal_bound(expression *a)

{
  expression *peVar1;
  bool bVar2;
  reference ppeVar3;
  _Self local_20;
  iterator literal_bound;
  iterator literal_pos;
  expression *a_local;
  
  literal_bound =
       std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::lower_bound
                 (&a->contents,&global_literal);
  local_20._M_node =
       (_Base_ptr)
       std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::upper_bound
                 (&a->contents,&global_literal);
  bVar2 = is_and(a);
  if (bVar2) {
    while (bVar2 = std::operator!=(&literal_bound,&local_20), bVar2) {
      ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&literal_bound);
      bVar2 = is_negated(*ppeVar3);
      if (bVar2) {
        delete_children(a);
        trans_lit(a,false);
        break;
      }
      ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&literal_bound);
      peVar1 = *ppeVar3;
      if (peVar1 != (expression *)0x0) {
        expression::~expression(peVar1);
        operator_delete(peVar1);
      }
      literal_bound =
           std::multiset<expression*,compareUUID,std::allocator<expression*>>::erase_abi_cxx11_
                     ((multiset<expression*,compareUUID,std::allocator<expression*>> *)&a->contents,
                      literal_bound._M_node);
    }
  }
  else {
    bVar2 = is_or(a);
    if (bVar2) {
      while (bVar2 = std::operator!=(&literal_bound,&local_20), bVar2) {
        ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&literal_bound);
        bVar2 = is_negated(*ppeVar3);
        if (!bVar2) {
          delete_children(a);
          trans_lit(a,true);
          break;
        }
        ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&literal_bound);
        peVar1 = *ppeVar3;
        if (peVar1 != (expression *)0x0) {
          expression::~expression(peVar1);
          operator_delete(peVar1);
        }
        literal_bound =
             std::multiset<expression*,compareUUID,std::allocator<expression*>>::erase_abi_cxx11_
                       ((multiset<expression*,compareUUID,std::allocator<expression*>> *)
                        &a->contents,literal_bound._M_node);
      }
    }
  }
  empty_expression(a);
  return;
}

Assistant:

void mathCore::universal_bound(expression* a) {
	auto literal_pos = a->contents.lower_bound(global_literal);		// Lower bound for literals in the expression
	auto literal_bound = a->contents.upper_bound(global_literal); // Upper bound for literals in the expression

	// If the expression is an AND
	if (mathCore::is_and(a)) {
		// Iterate over all literals
		while (literal_pos != literal_bound) {
			// If a literal 0 is found, the entire expression evaluates to 0
			if (mathCore::is_negated(*literal_pos)) {
				// Delete all the the children of the expression 
				mathCore::delete_children(a);
				// Turn the expression into a false literal
				mathCore::trans_lit(a, false);
				break;
			} else {
				// If the literal found was true, it can be removed
					delete *literal_pos;	// Delete the expression
					literal_pos = a->contents.erase(literal_pos);	// Advance the iterator safely
			}
		}
		// If the expression is an or statement 
	} else if (mathCore::is_or(a)) {
		// Iterate over all literals
		while (literal_pos != literal_bound) {
			// If a literal 1 is found, the entire expression evaluates to 1
			if (!(mathCore::is_negated(*literal_pos))) {
				// Delete all the the children of the expression 
				mathCore::delete_children(a);
				// Turn the expression into a true literal
				mathCore::trans_lit(a, true);
				break;
			} else {
				// If the literal found was false, it can be removed
				delete *literal_pos;	// Delete the expression
				literal_pos = a->contents.erase(literal_pos);	// Advance the iterator safely
			}
		}
	}
	mathCore::empty_expression(a);
}